

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp-conf.c
# Opt level: O1

int lwsws_get_config_vhosts
              (lws_context *context,lws_context_creation_info *info,char *d,char **cs,int *len)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  lws_dir_args da;
  char dd [128];
  jpargs a;
  lws_context_creation_info **local_1b8;
  char **local_1b0;
  undefined4 local_1a8;
  code *local_1a0;
  char local_198 [136];
  lws_context_creation_info *local_110;
  lws_context *local_108;
  lws_protocols *local_100;
  lws_protocols **local_f8;
  lws_extension *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 local_d8;
  byte local_34;
  
  memset(&local_110,0,0xe0);
  local_e8 = *cs;
  local_e0 = local_e8 + *len;
  local_d8 = 0;
  local_100 = info->protocols;
  local_f8 = info->pprotocols;
  local_f0 = info->extensions;
  local_110 = info;
  local_108 = context;
  lws_snprintf(local_198,0x7f,"%s/conf",d);
  uVar1 = lwsws_get_config(&local_110,local_198,paths_vhosts,0x3f,lejp_vhosts_cb);
  iVar3 = 1;
  if (uVar1 < 2) {
    lws_snprintf(local_198,0x7f,"%s/conf.d",d);
    local_1b0 = paths_vhosts;
    local_1a8 = 0x3f;
    local_1a0 = lejp_vhosts_cb;
    local_1b8 = &local_110;
    iVar2 = lws_dir(local_198,&local_1b8,lwsws_get_config_d_cb);
    if (iVar2 < 2) {
      *cs = local_e8;
      *len = (int)local_e0 - (int)local_e8;
      iVar3 = 0;
      if ((local_34 & 8) == 0) {
        iVar3 = 1;
        _lws_log(1,"Need at least one vhost\n");
      }
    }
  }
  return iVar3;
}

Assistant:

int
lwsws_get_config_vhosts(struct lws_context *context,
			struct lws_context_creation_info *info, const char *d,
			char **cs, int *len)
{
	struct lws_dir_args da;
	struct jpargs a;
	char dd[128];

	memset(&a, 0, sizeof(a));

	a.info = info;
	a.p = *cs;
	a.end = a.p + *len;
	a.valid = 0;
	a.context = context;
	a.protocols = info->protocols;
	a.pprotocols = info->pprotocols;
	a.extensions = info->extensions;

	lws_snprintf(dd, sizeof(dd) - 1, "%s/conf", d);
	if (lwsws_get_config(&a, dd, paths_vhosts,
			     LWS_ARRAY_SIZE(paths_vhosts), lejp_vhosts_cb) > 1)
		return 1;
	lws_snprintf(dd, sizeof(dd) - 1, "%s/conf.d", d);

	da.user = &a;
	da.paths = paths_vhosts;
	da.count_paths = LWS_ARRAY_SIZE(paths_vhosts),
	da.cb = lejp_vhosts_cb;

	if (lws_dir(dd, &da, lwsws_get_config_d_cb) > 1)
		return 1;

	*cs = a.p;
	*len = lws_ptr_diff(a.end, a.p);

	if (!a.any_vhosts) {
		lwsl_err("Need at least one vhost\n");
		return 1;
	}

//	lws_finalize_startup(context);

	return 0;
}